

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_import_ec_public_key
          (psa_ecc_curve_t curve,uint8_t *data,size_t data_length,mbedtls_ecp_keypair **p_ecp)

{
  mbedtls_ecp_point *pt;
  mbedtls_ecp_keypair *pmVar1;
  psa_status_t pVar2;
  int iVar3;
  mbedtls_ecp_keypair *ecp;
  mbedtls_ecp_keypair *local_38;
  
  local_38 = (mbedtls_ecp_keypair *)0x0;
  pVar2 = psa_prepare_import_ec_key(curve,data_length,1,&local_38);
  pmVar1 = local_38;
  if (pVar2 == 0) {
    pt = &local_38->Q;
    iVar3 = mbedtls_ecp_point_read_binary(&local_38->grp,pt,data,data_length);
    pVar2 = mbedtls_to_psa_error(iVar3);
    if (pVar2 == 0) {
      iVar3 = mbedtls_ecp_check_pubkey(&pmVar1->grp,pt);
      pVar2 = mbedtls_to_psa_error(iVar3);
      if (pVar2 == 0) {
        *p_ecp = pmVar1;
        return 0;
      }
    }
  }
  pmVar1 = local_38;
  if (local_38 != (mbedtls_ecp_keypair *)0x0) {
    mbedtls_ecp_keypair_free(local_38);
    free(pmVar1);
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_import_ec_public_key( psa_ecc_curve_t curve,
                                              const uint8_t *data,
                                              size_t data_length,
                                              mbedtls_ecp_keypair **p_ecp )
{
    psa_status_t status = PSA_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_keypair *ecp = NULL;

    status = psa_prepare_import_ec_key( curve, data_length, 1, &ecp );
    if( status != PSA_SUCCESS )
        goto exit;

    /* Load the public value. */
    status = mbedtls_to_psa_error(
        mbedtls_ecp_point_read_binary( &ecp->grp, &ecp->Q,
                                       data, data_length ) );
    if( status != PSA_SUCCESS )
        goto exit;

    /* Check that the point is on the curve. */
    status = mbedtls_to_psa_error(
        mbedtls_ecp_check_pubkey( &ecp->grp, &ecp->Q ) );
    if( status != PSA_SUCCESS )
        goto exit;

    *p_ecp = ecp;
    return( PSA_SUCCESS );

exit:
    if( ecp != NULL )
    {
        mbedtls_ecp_keypair_free( ecp );
        mbedtls_free( ecp );
    }
    return( status );
}